

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

bool __thiscall S2BooleanOperation::Impl::BuildOpType(Impl *this,OpType op_type)

{
  bool bVar1;
  pointer builder;
  ostream *poVar2;
  bool local_f5;
  S2LogMessage local_d8;
  undefined4 local_c8;
  PolylineModel local_b8;
  PolygonModel local_b4;
  undefined1 local_b0 [8];
  CrossingProcessor cp;
  OpType op_type_local;
  Impl *this_local;
  
  cp._140_4_ = op_type;
  local_b4 = S2BooleanOperation::Options::polygon_model(&this->op_->options_);
  local_b8 = S2BooleanOperation::Options::polyline_model(&this->op_->options_);
  bVar1 = S2BooleanOperation::Options::polyline_loops_have_boundaries(&this->op_->options_);
  builder = std::unique_ptr<S2Builder,_std::default_delete<S2Builder>_>::get(&this->builder_);
  CrossingProcessor::CrossingProcessor
            ((CrossingProcessor *)local_b0,&local_b4,&local_b8,bVar1,builder,
             &this->input_dimensions_,&this->input_crossings_);
  switch(cp._140_4_) {
  case (BADTYPE)0x0:
    this_local._7_1_ = AddBoundaryPair(this,true,true,true,(CrossingProcessor *)local_b0);
    break;
  case (BADTYPE)0x1:
    this_local._7_1_ = AddBoundaryPair(this,false,false,false,(CrossingProcessor *)local_b0);
    break;
  case (BADTYPE)0x2:
    this_local._7_1_ = AddBoundaryPair(this,false,true,false,(CrossingProcessor *)local_b0);
    break;
  case (BADTYPE)0x3:
    bVar1 = AddBoundaryPair(this,false,true,false,(CrossingProcessor *)local_b0);
    local_f5 = false;
    if (bVar1) {
      local_f5 = AddBoundaryPair(this,true,false,false,(CrossingProcessor *)local_b0);
    }
    this_local._7_1_ = local_f5;
    break;
  default:
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
               ,1999,kFatal,(ostream *)&std::cerr);
    poVar2 = S2LogMessage::stream(&local_d8);
    std::operator<<(poVar2,"Invalid S2BooleanOperation::OpType");
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_d8);
  }
  local_c8 = 1;
  CrossingProcessor::~CrossingProcessor((CrossingProcessor *)local_b0);
  return this_local._7_1_;
}

Assistant:

bool S2BooleanOperation::Impl::BuildOpType(OpType op_type) {
  // CrossingProcessor does the real work of emitting the output edges.
  CrossingProcessor cp(op_->options_.polygon_model(),
                       op_->options_.polyline_model(),
                       op_->options_.polyline_loops_have_boundaries(),
                       builder_.get(), &input_dimensions_, &input_crossings_);
  switch (op_type) {
    case OpType::UNION:
      // A | B == ~(~A & ~B)
      return AddBoundaryPair(true, true, true, &cp);

    case OpType::INTERSECTION:
      // A & B
      return AddBoundaryPair(false, false, false, &cp);

    case OpType::DIFFERENCE:
      // A - B = A & ~B
      return AddBoundaryPair(false, true, false, &cp);

    case OpType::SYMMETRIC_DIFFERENCE:
      // Compute the union of (A - B) and (B - A).
      return (AddBoundaryPair(false, true, false, &cp) &&
              AddBoundaryPair(true, false, false, &cp));
  }
  S2_LOG(FATAL) << "Invalid S2BooleanOperation::OpType";
  return false;
}